

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSite::~IfcSite(IfcSite *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer plVar3;
  void *pvVar4;
  
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject =
       0x865dd8;
  *(undefined8 *)&this->field_0x1f0 = 0x865ec8;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x865e00;
  (this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x865e28;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x865e50;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.field_0x100 = 0x865e78;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).field_0x158 = 0x865ea0;
  pcVar2 = (this->LandTitleNumber).ptr._M_dataplus._M_p;
  paVar1 = &(this->LandTitleNumber).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  plVar3 = (this->RefLongitude).ptr.super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar3 != (pointer)0x0) {
    operator_delete(plVar3,(long)(this->RefLongitude).ptr.super_vector<long,_std::allocator<long>_>.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)plVar3);
  }
  pvVar4 = *(void **)&(this->super_IfcSpatialStructureElement).field_0x168;
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,*(long *)&this->field_0x178 - (long)pvVar4);
  }
  IfcSpatialStructureElement::~IfcSpatialStructureElement
            (&this->super_IfcSpatialStructureElement,&PTR_construction_vtable_24__00865ee0);
  operator_delete(this,0x208);
  return;
}

Assistant:

IfcSite() : Object("IfcSite") {}